

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O1

void __thiscall
kj::TlsConnectionReceiver::onAcceptSuccess(TlsConnectionReceiver *this,AuthenticatedStream *stream)

{
  PromiseArenaMember *node;
  TlsConnectionReceiver *node_00;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:570:38),_void>
  acceptPromise;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:575:42),_kj::AuthenticatedStream>
  sslPromise;
  PromiseArenaMember *local_30;
  anon_class_16_2_53b01f7b local_28;
  TlsConnectionReceiver *local_18;
  
  local_28.this = this;
  local_28.stream = stream;
  evalNow<kj::TlsConnectionReceiver::onAcceptSuccess(kj::AuthenticatedStream&&)::_lambda()_1_>
            ((kj *)&local_30,&local_28);
  local_18 = this;
  Promise<kj::AuthenticatedStream>::
  then<kj::TlsConnectionReceiver::onAcceptSuccess(kj::AuthenticatedStream&&)::_lambda(auto:1&&)_1_>
            ((Promise<kj::AuthenticatedStream> *)&local_28,
             (anon_class_8_1_8991fb9c_for_func *)&local_30);
  TaskSet::add(&this->tasks,(Promise<void> *)&local_28);
  node_00 = local_28.this;
  if (local_28.this != (TlsConnectionReceiver *)0x0) {
    local_28.this = (TlsConnectionReceiver *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
  }
  node = local_30;
  if (local_30 != (PromiseArenaMember *)0x0) {
    local_30 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  return;
}

Assistant:

void onAcceptSuccess(AuthenticatedStream&& stream) {
    // Queue this stream to go through SSL_accept.

    auto acceptPromise = kj::evalNow([&] {
      // Do the SSL acceptance procedure.
      return tls.wrapServer(kj::mv(stream));
    });

    auto sslPromise = acceptPromise.then([this](auto&& stream) -> Promise<void> {
      // This is only attached to the success path, thus the error handler will catch if our
      // promise fails.
      queue.push(kj::mv(stream));
      return kj::READY_NOW;
    });
    tasks.add(kj::mv(sslPromise));
  }